

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPlaneCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtConvexPlaneCollisionAlgorithm::cbtConvexPlaneCollisionAlgorithm
          (cbtConvexPlaneCollisionAlgorithm *this,cbtPersistentManifold *mf,
          cbtCollisionAlgorithmConstructionInfo *ci,cbtCollisionObjectWrapper *col0Wrap,
          cbtCollisionObjectWrapper *col1Wrap,bool isSwapped,int numPerturbationIterations,
          int minimumPointsPerturbationThreshold)

{
  cbtDispatcher *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  cbtCollisionObjectWrapper *pcVar3;
  
  cbtCollisionAlgorithm::cbtCollisionAlgorithm(&this->super_cbtCollisionAlgorithm,ci);
  (this->super_cbtCollisionAlgorithm)._vptr_cbtCollisionAlgorithm =
       (_func_int **)&PTR__cbtConvexPlaneCollisionAlgorithm_00b48c70;
  this->m_ownManifold = false;
  this->m_manifoldPtr = mf;
  this->m_isSwapped = isSwapped;
  this->m_numPerturbationIterations = numPerturbationIterations;
  this->m_minimumPointsPerturbationThreshold = minimumPointsPerturbationThreshold;
  if (mf == (cbtPersistentManifold *)0x0) {
    pcVar1 = (this->super_cbtCollisionAlgorithm).m_dispatcher;
    pcVar3 = col0Wrap;
    if (isSwapped) {
      pcVar3 = col1Wrap;
      col1Wrap = col0Wrap;
    }
    iVar2 = (*pcVar1->_vptr_cbtDispatcher[6])
                      (pcVar1,pcVar3->m_collisionObject,col1Wrap->m_collisionObject);
    if ((char)iVar2 != '\0') {
      pcVar1 = (this->super_cbtCollisionAlgorithm).m_dispatcher;
      iVar2 = (*pcVar1->_vptr_cbtDispatcher[3])
                        (pcVar1,pcVar3->m_collisionObject,col1Wrap->m_collisionObject);
      this->m_manifoldPtr = (cbtPersistentManifold *)CONCAT44(extraout_var,iVar2);
      this->m_ownManifold = true;
    }
  }
  return;
}

Assistant:

cbtConvexPlaneCollisionAlgorithm::cbtConvexPlaneCollisionAlgorithm(cbtPersistentManifold* mf, const cbtCollisionAlgorithmConstructionInfo& ci, const cbtCollisionObjectWrapper* col0Wrap, const cbtCollisionObjectWrapper* col1Wrap, bool isSwapped, int numPerturbationIterations, int minimumPointsPerturbationThreshold)
	: cbtCollisionAlgorithm(ci),
	  m_ownManifold(false),
	  m_manifoldPtr(mf),
	  m_isSwapped(isSwapped),
	  m_numPerturbationIterations(numPerturbationIterations),
	  m_minimumPointsPerturbationThreshold(minimumPointsPerturbationThreshold)
{
	const cbtCollisionObjectWrapper* convexObjWrap = m_isSwapped ? col1Wrap : col0Wrap;
	const cbtCollisionObjectWrapper* planeObjWrap = m_isSwapped ? col0Wrap : col1Wrap;

	if (!m_manifoldPtr && m_dispatcher->needsCollision(convexObjWrap->getCollisionObject(), planeObjWrap->getCollisionObject()))
	{
		m_manifoldPtr = m_dispatcher->getNewManifold(convexObjWrap->getCollisionObject(), planeObjWrap->getCollisionObject());
		m_ownManifold = true;
	}
}